

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints.cc
# Opt level: O0

bool __thiscall
bssl::NameConstraints::Parse
          (NameConstraints *this,Input extension_value,bool is_critical,CertErrors *errors)

{
  bool bVar1;
  Span<const_unsigned_char> *pSVar2;
  uint uVar3;
  undefined1 local_b8 [8];
  optional<bssl::der::Input> excluded_subtrees_value;
  undefined1 local_90 [8];
  optional<bssl::der::Input> permitted_subtrees_value;
  Parser sequence_parser;
  undefined1 local_50 [8];
  Parser extension_parser;
  CertErrors *errors_local;
  bool is_critical_local;
  NameConstraints *this_local;
  Input extension_value_local;
  
  extension_parser.advance_len_ = (size_t)errors;
  if (errors == (CertErrors *)0x0) {
    abort();
  }
  bssl::der::Parser::Parser((Parser *)local_50,extension_value);
  bssl::der::Parser::Parser
            ((Parser *)
             &permitted_subtrees_value.super__Optional_base<bssl::der::Input,_true,_true>._M_payload
              .super__Optional_payload_base<bssl::der::Input>._M_engaged);
  bVar1 = bssl::der::Parser::ReadSequence
                    ((Parser *)local_50,
                     (Parser *)
                     &permitted_subtrees_value.super__Optional_base<bssl::der::Input,_true,_true>.
                      _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged);
  if (bVar1) {
    bVar1 = bssl::der::Parser::HasMore((Parser *)local_50);
    if (bVar1) {
      extension_value_local.data_.size_._7_1_ = false;
    }
    else {
      ::std::optional<bssl::der::Input>::optional((optional<bssl::der::Input> *)local_90);
      bVar1 = bssl::der::Parser::ReadOptionalTag
                        ((Parser *)
                         &permitted_subtrees_value.
                          super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                          super__Optional_payload_base<bssl::der::Input>._M_engaged,0xa0000000,
                         (optional<bssl::der::Input> *)local_90);
      if (bVar1) {
        bVar1 = ::std::optional::operator_cast_to_bool((optional *)local_90);
        if (bVar1) {
          pSVar2 = &::std::optional<bssl::der::Input>::value((optional<bssl::der::Input> *)local_90)
                    ->data_;
          excluded_subtrees_value.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
          super__Optional_payload_base<bssl::der::Input>._16_8_ = pSVar2->data_;
          bVar1 = anon_unknown_0::ParseGeneralSubtrees
                            ((Input)*pSVar2,&this->permitted_subtrees_,
                             (CertErrors *)extension_parser.advance_len_);
          if (!bVar1) {
            return false;
          }
        }
        uVar3 = 0x96;
        if (is_critical) {
          uVar3 = 0x1ff;
        }
        this->constrained_name_types_ =
             (this->permitted_subtrees_).present_name_types & uVar3 | this->constrained_name_types_;
        ::std::optional<bssl::der::Input>::optional((optional<bssl::der::Input> *)local_b8);
        bVar1 = bssl::der::Parser::ReadOptionalTag
                          ((Parser *)
                           &permitted_subtrees_value.
                            super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                            super__Optional_payload_base<bssl::der::Input>._M_engaged,0xa0000001,
                           (optional<bssl::der::Input> *)local_b8);
        if (bVar1) {
          bVar1 = ::std::optional::operator_cast_to_bool((optional *)local_b8);
          if (bVar1) {
            pSVar2 = &::std::optional<bssl::der::Input>::value
                                ((optional<bssl::der::Input> *)local_b8)->data_;
            bVar1 = anon_unknown_0::ParseGeneralSubtrees
                              ((Input)*pSVar2,&this->excluded_subtrees_,
                               (CertErrors *)extension_parser.advance_len_);
            if (!bVar1) {
              return false;
            }
          }
          uVar3 = 0x96;
          if (is_critical) {
            uVar3 = 0x1ff;
          }
          this->constrained_name_types_ =
               (this->excluded_subtrees_).present_name_types & uVar3 | this->constrained_name_types_
          ;
          bVar1 = ::std::optional::operator_cast_to_bool((optional *)local_90);
          if ((bVar1) ||
             (bVar1 = ::std::optional::operator_cast_to_bool((optional *)local_b8), bVar1)) {
            bVar1 = bssl::der::Parser::HasMore
                              ((Parser *)
                               &permitted_subtrees_value.
                                super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                                super__Optional_payload_base<bssl::der::Input>._M_engaged);
            if (bVar1) {
              extension_value_local.data_.size_._7_1_ = false;
            }
            else {
              extension_value_local.data_.size_._7_1_ = true;
            }
          }
          else {
            extension_value_local.data_.size_._7_1_ = false;
          }
        }
        else {
          extension_value_local.data_.size_._7_1_ = false;
        }
      }
      else {
        extension_value_local.data_.size_._7_1_ = false;
      }
    }
  }
  else {
    extension_value_local.data_.size_._7_1_ = false;
  }
  return extension_value_local.data_.size_._7_1_;
}

Assistant:

bool NameConstraints::Parse(der::Input extension_value, bool is_critical,
                            CertErrors *errors) {
  BSSL_CHECK(errors);

  der::Parser extension_parser(extension_value);
  der::Parser sequence_parser;

  // NameConstraints ::= SEQUENCE {
  //      permittedSubtrees       [0]     GeneralSubtrees OPTIONAL,
  //      excludedSubtrees        [1]     GeneralSubtrees OPTIONAL }
  if (!extension_parser.ReadSequence(&sequence_parser)) {
    return false;
  }
  if (extension_parser.HasMore()) {
    return false;
  }

  std::optional<der::Input> permitted_subtrees_value;
  if (!sequence_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0,
          &permitted_subtrees_value)) {
    return false;
  }
  if (permitted_subtrees_value &&
      !ParseGeneralSubtrees(permitted_subtrees_value.value(),
                            &permitted_subtrees_, errors)) {
    return false;
  }
  constrained_name_types_ |=
      permitted_subtrees_.present_name_types &
      (is_critical ? GENERAL_NAME_ALL_TYPES : kSupportedNameTypes);

  std::optional<der::Input> excluded_subtrees_value;
  if (!sequence_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 1,
          &excluded_subtrees_value)) {
    return false;
  }
  if (excluded_subtrees_value &&
      !ParseGeneralSubtrees(excluded_subtrees_value.value(),
                            &excluded_subtrees_, errors)) {
    return false;
  }
  constrained_name_types_ |=
      excluded_subtrees_.present_name_types &
      (is_critical ? GENERAL_NAME_ALL_TYPES : kSupportedNameTypes);

  // RFC 5280 section 4.2.1.10:
  // Conforming CAs MUST NOT issue certificates where name constraints is an
  // empty sequence. That is, either the permittedSubtrees field or the
  // excludedSubtrees MUST be present.
  if (!permitted_subtrees_value && !excluded_subtrees_value) {
    return false;
  }

  if (sequence_parser.HasMore()) {
    return false;
  }

  return true;
}